

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<double,double,duckdb::UnaryOperatorWrapper,duckdb::Log2Operator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  VectorType VVar3;
  idx_t iVar4;
  double *pdVar5;
  ValidityMask *ldata_00;
  double *result_data_00;
  ValidityMask *pVVar6;
  ValidityMask *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar7;
  double dVar8;
  double *ldata_3;
  double *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  double *ldata_2;
  double *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  double *ldata_1;
  double *result_data_1;
  double *ldata;
  double *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  SelectionVector *in_stack_fffffffffffffe68;
  UnifiedVectorFormat *in_stack_fffffffffffffe70;
  Vector *in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  VectorType vector_type_p;
  SelectionVector *sel_vector;
  Vector *in_stack_fffffffffffffe90;
  undefined1 uVar9;
  void *in_stack_fffffffffffffe98;
  ValidityMask *in_stack_fffffffffffffea0;
  double *pdVar10;
  ValidityMask *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  double *in_stack_fffffffffffffec0;
  undefined7 in_stack_ffffffffffffff20;
  idx_t in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  undefined1 local_b8 [72];
  SelectionVector *local_70;
  ValidityMask *local_68;
  double *local_60;
  Vector *local_58;
  optional_idx local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  double *local_30;
  char local_22;
  byte local_21;
  ValidityMask *local_18;
  Vector *local_10;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
    local_40 = FlatVector::GetData<double>((Vector *)0x20bda25);
    local_48 = FlatVector::GetData<double>((Vector *)0x20bda3a);
    FlatVector::Validity((Vector *)0x20bda7f);
    FlatVector::Validity((Vector *)0x20bda94);
    ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::Log2Operator>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (bool)uVar9);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
    local_30 = ConstantVector::GetData<double>((Vector *)0x20bd966);
    local_38 = ConstantVector::GetData<double>((Vector *)0x20bd97b);
    bVar2 = ConstantVector::IsNull((Vector *)0x20bd990);
    if (bVar2) {
      ConstantVector::SetNull(in_stack_fffffffffffffeb0,(bool)uVar9);
    }
    else {
      ConstantVector::SetNull(in_stack_fffffffffffffeb0,(bool)uVar9);
      ConstantVector::Validity(local_10);
      dVar8 = UnaryOperatorWrapper::Operation<duckdb::Log2Operator,double,double>
                        ((double)in_stack_fffffffffffffe70,(ValidityMask *)in_stack_fffffffffffffe68
                         ,CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
      *local_30 = dVar8;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_50 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_50);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0),
         (ValidityMask *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0)) {
        local_58 = DictionaryVector::Child((Vector *)0x20bdb3c);
        VVar3 = Vector::GetVectorType(local_58);
        if (VVar3 == FLAT_VECTOR) {
          local_60 = FlatVector::GetData<double>((Vector *)0x20bdb66);
          uVar9 = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
          pVVar6 = (ValidityMask *)FlatVector::GetData<double>((Vector *)0x20bdb7b);
          pdVar10 = local_60;
          local_68 = pVVar6;
          pdVar5 = (double *)optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0);
          ldata_00 = FlatVector::Validity((Vector *)0x20bdbbc);
          FlatVector::Validity((Vector *)0x20bdbce);
          ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::Log2Operator>
                    ((double *)ldata_00,pdVar5,(idx_t)pdVar10,pVVar6,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98,(bool)uVar9);
          local_70 = DictionaryVector::SelVector((Vector *)0x20bdc0e);
          optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0);
          Vector::Dictionary(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             (idx_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          return;
        }
      }
    }
    pdVar10 = (double *)local_b8;
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe70);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (UnifiedVectorFormat *)CONCAT17(VVar1,in_stack_ffffffffffffff20));
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    result_data_00 = FlatVector::GetData<double>((Vector *)0x20bdcb6);
    pdVar5 = result_data_00;
    UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)local_b8);
    uVar9 = (undefined1)((ulong)pdVar5 >> 0x38);
    sel_vector = (SelectionVector *)(local_b8 + 0x10);
    pVVar6 = FlatVector::Validity((Vector *)0x20bdd2d);
    uVar7 = local_21 & 1;
    ExecuteLoop<double,double,duckdb::UnaryOperatorWrapper,duckdb::Log2Operator>
              (pdVar10,result_data_00,(idx_t)pVVar6,sel_vector,(ValidityMask *)local_b8._0_8_,
               local_18,in_stack_fffffffffffffeb0,(bool)uVar9);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}